

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp:3183:34)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_third_party_catch2v3_amalgamated_catch_amalgamated_cpp:3183:34)>
          *this,string *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_type sVar4;
  ConfigData *pCVar5;
  pointer pRVar6;
  undefined8 __k;
  int iVar7;
  ReporterSpec *spec;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar8;
  undefined4 extraout_var;
  const_iterator cVar9;
  undefined8 *puVar10;
  pointer pRVar11;
  uint uVar12;
  pointer *ppcVar13;
  StringRef reporterSpec;
  size_type __dnew;
  size_type __dnew_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  Optional<Catch::ReporterSpec> parsed;
  _Alloc_hider local_150;
  pointer local_148;
  pointer local_140;
  undefined8 uStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined **local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined1 local_c0 [16];
  _Alloc_hider local_b0;
  size_type sStack_a8;
  
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_assign((string *)&local_110);
  local_e8 = 0;
  local_f0 = &PTR__BasicResult_001b2540;
  local_d8 = 0;
  local_d0 = 0;
  local_e0 = &local_d0;
  if (local_110._M_string_length == 0) {
    local_150._M_p = (pointer)0x1d;
    local_c0._0_8_ = (ReporterSpec *)&local_b0;
    local_c0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_c0,(ulong)&local_150);
    local_b0._M_p = local_150._M_p;
    *(undefined8 *)((long)&(((ReporterSpec *)local_c0._0_8_)->m_name)._M_string_length + 5) =
         0x74726f7065722079;
    *(undefined8 *)((long)&(((ReporterSpec *)local_c0._0_8_)->m_name).field_2 + 5) =
         0x2e63657073207265;
    (((ReporterSpec *)local_c0._0_8_)->m_name)._M_dataplus._M_p = (pointer)0x6465766965636552;
    (((ReporterSpec *)local_c0._0_8_)->m_name)._M_string_length = 0x72207974706d6520;
    local_c0._8_8_ = local_150._M_p;
    local_150._M_p[local_c0._0_8_] = '\0';
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = RuntimeError;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
    paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
    if ((ReporterSpec *)local_c0._0_8_ == (ReporterSpec *)&local_b0) {
      paVar1->_M_allocated_capacity = (size_type)local_150._M_p;
      *(size_type *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = sStack_a8;
    }
    else {
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)local_c0._0_8_;
      (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
           (size_type)local_150._M_p;
    }
    (__return_storage_ptr__->m_errorMessage)._M_string_length = (size_type)local_150._M_p;
    goto LAB_001608e0;
  }
  reporterSpec.m_size = local_110._M_string_length;
  reporterSpec.m_start = local_110._M_dataplus._M_p;
  parseReporterSpec((Optional<Catch::ReporterSpec> *)local_c0,reporterSpec);
  __k = local_c0._0_8_;
  if ((ReporterSpec *)local_c0._0_8_ == (ReporterSpec *)0x0) {
    std::operator+(&local_130,"Could not parse reporter spec \'",&local_110);
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
LAB_00160811:
    ppcVar13 = (pointer *)(puVar10 + 2);
    if ((pointer *)*puVar10 == ppcVar13) {
      local_140 = *ppcVar13;
      uStack_138 = puVar10[3];
      local_150._M_p = (pointer)&local_140;
    }
    else {
      local_140 = *ppcVar13;
      local_150._M_p = (pointer)*puVar10;
    }
    sVar4 = puVar10[1];
    *puVar10 = ppcVar13;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = RuntimeError;
    (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
    paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
    if ((pointer *)local_150._M_p == &local_140) {
      paVar1->_M_allocated_capacity = (size_type)local_140;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_138;
    }
    else {
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_150._M_p;
      (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity = (size_type)local_140;
    }
    (__return_storage_ptr__->m_errorMessage)._M_string_length = sVar4;
    local_148 = (pointer)0x0;
    local_140 = (pointer)((ulong)local_140 & 0xffffffffffffff00);
    local_150._M_p = (pointer)&local_140;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pSVar8 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar7 = (*(pSVar8->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar8);
    lVar2 = *(long *)CONCAT44(extraout_var,iVar7);
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
                    *)(lVar2 + 0x18),(key_type *)__k);
    if (cVar9._M_node == (_Base_ptr)(lVar2 + 0x20)) {
      std::operator+(&local_130,"Unrecognized reporter, \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
      goto LAB_00160811;
    }
    pbVar3 = ((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(__k + 0x20))->nullableValue;
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::
    emplace_back<Catch::ReporterSpec>
              (&((this->m_lambda).config)->reporterSpecifications,(ReporterSpec *)local_c0._0_8_);
    if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pCVar5 = (this->m_lambda).config;
      pRVar11 = (pCVar5->reporterSpecifications).
                super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pRVar6 = (pCVar5->reporterSpecifications).
               super__Vector_base<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pRVar11 == pRVar6) goto LAB_00160701;
      uVar12 = 0;
      do {
        uVar12 = uVar12 + ((pRVar11->m_outputFileName).nullableValue ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        pRVar11 = pRVar11 + 1;
      } while (pRVar11 != pRVar6);
      if (uVar12 < 2) goto LAB_00160701;
      local_130._M_dataplus._M_p = (pointer)0x33;
      local_150._M_p = (pointer)&local_140;
      local_150._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_150,(ulong)&local_130);
      local_148 = local_130._M_dataplus._M_p;
      *(undefined8 *)((long)local_150._M_p + 0x20) = 0x6f20646569666963;
      *(undefined8 *)((long)local_150._M_p + 0x28) = 0x6966207475707475;
      *(undefined8 *)((long)local_150._M_p + 0x10) = 0x61682079616d2072;
      *(undefined8 *)((long)local_150._M_p + 0x18) = 0x6570736e75206576;
      *(undefined8 *)local_150._M_p = 0x656e6f20796c6e4f;
      *(undefined8 *)((long)local_150._M_p + 8) = 0x6574726f70657220;
      builtin_strncpy((char *)((long)local_150._M_p + 0x2f),"ile.",4);
      *(char *)((long)local_150._M_p + (long)local_130._M_dataplus._M_p) = '\0';
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase.m_type = RuntimeError;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
      paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if ((pointer *)local_150._M_p == &local_140) {
        paVar1->_M_allocated_capacity = (size_type)local_130._M_dataplus._M_p;
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) = uStack_138;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_150._M_p;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             (size_type)local_130._M_dataplus._M_p;
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length =
           (size_type)local_130._M_dataplus._M_p;
      local_140 = local_148;
    }
    else {
LAB_00160701:
      *(undefined8 *)
       &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
        super_ResultBase.m_type = 0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
    }
  }
  Optional<Catch::ReporterSpec>::reset((Optional<Catch::ReporterSpec> *)local_c0);
LAB_001608e0:
  local_f0 = &PTR__BasicResult_001b2540;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }